

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O0

Reals __thiscall
Omega_h::compute_flip_normals_dim<3>
          (Omega_h *this,Mesh *mesh,Bytes *sides_are_exposed,Bytes *verts_matter,
          Real simple_algorithm_threshold)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  Write<double> local_1d0;
  Read<double> local_1c0;
  undefined1 local_1b0 [8];
  type f;
  Bytes sides_are_exposed_copy;
  Real threshold_copy;
  string local_108 [32];
  undefined1 local_e8 [8];
  Write<double> out;
  Reals coords;
  undefined1 local_b8 [8];
  LOs verts_that_matter;
  undefined1 local_98 [8];
  LOs sv2v;
  Adj v2s;
  int side_dim;
  Real simple_algorithm_threshold_local;
  Bytes *verts_matter_local;
  Bytes *sides_are_exposed_local;
  Mesh *mesh_local;
  pointer local_10;
  
  Mesh::ask_up((Adj *)&sv2v.write_.shared_alloc_.direct_ptr,mesh,0,2);
  Mesh::ask_verts_of((Mesh *)local_98,(Int)mesh);
  Read<signed_char>::Read((Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr,verts_matter)
  ;
  collect_marked((Omega_h *)local_b8,(Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&coords.write_.shared_alloc_.direct_ptr);
  Mesh::coords((Mesh *)&out.shared_alloc_.direct_ptr);
  LVar1 = Mesh::nverts(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"",(allocator *)((long)&threshold_copy + 7));
  Write<double>::Write((Write<double> *)local_e8,LVar1 * 3,0.0,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&threshold_copy + 7));
  Read<signed_char>::Read((Read<signed_char> *)&f.out.shared_alloc_.direct_ptr,sides_are_exposed);
  Read<int>::Read((Read<int> *)local_1b0,(Read<int> *)local_b8);
  Adj::Adj((Adj *)&f.verts_that_matter.write_.shared_alloc_.direct_ptr,
           (Adj *)&sv2v.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.v2s.codes.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&f.out.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.sides_are_exposed_copy.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_98);
  Read<double>::Read((Read<double> *)&f.sv2v.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&out.shared_alloc_.direct_ptr);
  f.coords.write_.shared_alloc_.direct_ptr = (void *)simple_algorithm_threshold;
  Write<double>::Write((Write<double> *)&f.threshold_copy,(Write<double> *)local_e8);
  if (((ulong)local_b8 & 1) == 0) {
    local_10 = (pointer)*(size_t *)local_b8;
  }
  else {
    local_10 = (pointer)((ulong)local_b8 >> 3);
  }
  parallel_for<Omega_h::compute_flip_normals_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)::_lambda(int)_1_>
            ((LO)((ulong)local_10 >> 2),(type *)local_1b0,"compute_flip_normals");
  Write<double>::Write(&local_1d0,(Write<double> *)local_e8);
  Read<double>::Read(&local_1c0,&local_1d0);
  Mesh::sync_array<double>((Mesh *)this,(Int)mesh,(Read<double> *)0x0,(Int)&local_1c0);
  Read<double>::~Read(&local_1c0);
  Write<double>::~Write(&local_1d0);
  compute_flip_normals_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,double)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)local_1b0);
  Read<signed_char>::~Read((Read<signed_char> *)&f.out.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_e8);
  Read<double>::~Read((Read<double> *)&out.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_b8);
  Read<int>::~Read((Read<int> *)local_98);
  Adj::~Adj((Adj *)&sv2v.write_.shared_alloc_.direct_ptr);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals compute_flip_normals_dim(Mesh* mesh, Bytes sides_are_exposed,
    Bytes verts_matter,
    Real simple_algorithm_threshold = 0.95)  // constant given by Aubry and Lohner
{
  constexpr auto side_dim = dim - 1;
  auto v2s = mesh->ask_up(VERT, side_dim);
  auto sv2v = mesh->ask_verts_of(side_dim);
  auto verts_that_matter = collect_marked(verts_matter);
  auto coords = mesh->coords();
  auto out = Write<Real>(mesh->nverts() * dim, 0.0);
  auto const threshold_copy = simple_algorithm_threshold;
  auto sides_are_exposed_copy = sides_are_exposed;
  auto f = OMEGA_H_LAMBDA(LO vm) {
    auto v = verts_that_matter[vm];
    auto N_c = zero_vector<dim>();
    constexpr auto max_adj_sides =
        SimplexAvgDegree<side_dim, VERT, side_dim>::value * 4;
    Few<Vector<dim>, max_adj_sides> N;
    auto n = 0;
    for (auto vs = v2s.a2ab[v]; vs < v2s.a2ab[v + 1]; ++vs) {
      auto s = v2s.ab2b[vs];
      if (!sides_are_exposed_copy[s]) continue;
      OMEGA_H_CHECK(n < max_adj_sides);
      constexpr auto side_dim2 = dim - 1;
      auto ssv2v = gather_verts<side_dim2 + 1>(sv2v, s);
      auto ssv2x = gather_vectors<side_dim2 + 1, dim>(coords, ssv2v);
      auto svec = get_side_vector(ssv2x);
      N_c += svec;  // svec is the area weighted face normal
      N[n++] = normalize(svec);
    }
    // as suggested by Aubry and Lohner, start with an initial guess done by
    // some kind of averaging (area weighted being an option)
    N_c = normalize(N_c);
    // if that is roughly the same as all the face normals, just accept it
    // and don't bother with the expensive algorithm.
    // this is especially a good idea because most models are mostly flat
    // surfaces
    Int i;
    for (i = 0; i < n; ++i) {
      if (N_c * N[i] < threshold_copy) break;
    }
    if (i < n) {
      // nope, we actually have some nontrivial normals here.
      // run the super expensive algorithm.
      N_c = get_most_normal_normal(N, n);
    }
    set_vector(out, v, N_c);
  };
  parallel_for(verts_that_matter.size(), f, "compute_flip_normals");
  return mesh->sync_array(VERT, Reals(out), dim);
}